

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fusion.c
# Opt level: O1

void test_gfmul(void)

{
  ulong uVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  ulong uVar70;
  ulong uVar71;
  ulong uVar72;
  ulong uVar73;
  ulong uVar74;
  uint8_t uVar75;
  ptls_fusion_aesgcm_context_t *ctx;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  
  uVar75 = (uint8_t)ptls_fusion_can_aesni256;
  ctx = (ptls_fusion_aesgcm_context_t *)malloc(0x2a0);
  memset(ctx,0,0x1e4);
  (ctx->ecb).aesni256 = uVar75;
  *(undefined8 *)&(ctx->ecb).field_0x1e5 = 0;
  *(undefined8 *)&(ctx->ecb).field_0x1ed = 0;
  *(undefined8 *)&(ctx->ecb).field_0x1f0 = 0;
  *(undefined8 *)&(ctx->ecb).field_0x1f8 = 0;
  ctx->capacity = 0x40;
  ctx->ghash_cnt = 0;
  *(undefined8 *)&ctx->field_0x210 = 0;
  *(undefined8 *)&ctx->field_0x218 = 0;
  if (uVar75 == '\0') {
    ctx[1].ecb.keys.m128[0][0] = 0x6f77206f6c6c6568;
    ctx[1].ecb.keys.m128[0][1] = 0x65796220646c72;
  }
  else {
    ctx[1].ecb.keys.m128[1][0] = 0x6f77206f6c6c6568;
    ctx[1].ecb.keys.m128[1][1] = 0x65796220646c72;
  }
  uVar1 = ctx->ghash_cnt;
  while (uVar1 < 4) {
    setup_one_ghash_entry(ctx);
    uVar1 = ctx->ghash_cnt;
  }
  if ((ctx->ecb).aesni256 != '\0') {
    halt_baddata();
  }
  auVar76._8_8_ = 0;
  auVar76._0_8_ = ctx[1].ecb.keys.m128[0][0];
  auVar3 = (undefined1  [16])0x0;
  for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
    if ((auVar76 & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
      auVar3 = auVar3 ^ ZEXT816(0x6265656662656566) << uVar2;
    }
  }
  auVar78._8_8_ = 0;
  auVar78._0_8_ = ctx[1].ecb.keys.m128[0][1];
  auVar76 = (undefined1  [16])0x0;
  for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
    if ((auVar78 & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
      auVar76 = auVar76 ^ ZEXT816(0x6465616464656164) << uVar2;
    }
  }
  auVar77._8_8_ = 0;
  auVar77._0_8_ = ctx[1].ecb.keys.m128[1][0];
  auVar78 = (undefined1  [16])0x0;
  for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
    if ((ZEXT816(0x600040206000402) & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
      auVar78 = auVar78 ^ auVar77 << uVar2;
    }
  }
  auVar78 = auVar3 ^ auVar78 ^ auVar76;
  auVar79 = vpslldq_avx(auVar78,8);
  auVar77 = vpsrldq_avx(auVar78,8);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = SUB168(auVar3 ^ auVar79,0);
  auVar78 = (undefined1  [16])0x0;
  for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
    if ((auVar80 & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
      auVar78 = auVar78 ^ ZEXT816(0xc200000000000000) << uVar2;
    }
  }
  auVar3 = vpshufd_avx(auVar3 ^ auVar79,0x4e);
  auVar79._8_8_ = 0;
  auVar79._0_8_ = SUB168(auVar78 ^ auVar3,0);
  auVar80 = (undefined1  [16])0x0;
  for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
    if ((auVar79 & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
      auVar80 = auVar80 ^ ZEXT816(0xc200000000000000) << uVar2;
    }
  }
  auVar3 = vpshufd_avx(auVar78 ^ auVar3,0x4e);
  _ok((uint)((auVar80 ^ auVar77 ^ auVar3 ^ auVar76) == _DAT_0012b770),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/fusion.c",0x7f);
  if ((ctx->ecb).aesni256 != '\0') {
    halt_baddata();
  }
  auVar4._8_8_ = 0;
  auVar4._0_8_ = ctx[1].ecb.keys.m128[2][0];
  auVar3 = (undefined1  [16])0x0;
  for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
    if ((auVar4 & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
      auVar3 = auVar3 ^ ZEXT816(0x73756d20646f6c6f) << uVar2;
    }
  }
  auVar42._8_8_ = 0;
  auVar42._0_8_ = ctx[1].ecb.keys.m128[2][1];
  auVar76 = (undefined1  [16])0x0;
  for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
    if ((auVar42 & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
      auVar76 = auVar76 ^ ZEXT816(0x4c6f72656d206970) << uVar2;
    }
  }
  auVar60._8_8_ = 0;
  auVar60._0_8_ = ctx[1].ecb.keys.m128[3][0];
  auVar78 = (undefined1  [16])0x0;
  for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
    if ((ZEXT816(0x3f1a1f45094f051f) & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
      auVar78 = auVar78 ^ auVar60 << uVar2;
    }
  }
  auVar5._8_8_ = 0;
  auVar5._0_8_ = ctx[1].ecb.keys.m128[0][0];
  auVar77 = (undefined1  [16])0x0;
  for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
    if ((auVar5 & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
      auVar77 = auVar77 ^ ZEXT816(0x65742c20636f6e00) << uVar2;
    }
  }
  auVar43._8_8_ = 0;
  auVar43._0_8_ = ctx[1].ecb.keys.m128[0][1];
  auVar80 = (undefined1  [16])0x0;
  for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
    if ((auVar43 & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
      auVar80 = auVar80 ^ ZEXT816(0x722073697420616d) << uVar2;
    }
  }
  auVar61._8_8_ = 0;
  auVar61._0_8_ = ctx[1].ecb.keys.m128[1][0];
  auVar79 = (undefined1  [16])0x0;
  for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
    if ((ZEXT816(0x17545f49174f0f6d) & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
      auVar79 = auVar79 ^ auVar61 << uVar2;
    }
  }
  auVar78 = auVar78 ^ auVar79 ^ auVar77 ^ auVar3 ^ auVar80 ^ auVar76;
  auVar79 = vpslldq_avx(auVar78,8);
  auVar79 = auVar77 ^ auVar3 ^ auVar79;
  auVar78 = vpsrldq_avx(auVar78,8);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = auVar79._0_8_;
  auVar3 = (undefined1  [16])0x0;
  for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
    if ((auVar30 & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
      auVar3 = auVar3 ^ ZEXT816(0xc200000000000000) << uVar2;
    }
  }
  auVar77 = vpshufd_avx(auVar79,0x4e);
  auVar31._8_8_ = 0;
  auVar31._0_8_ = SUB168(auVar3 ^ auVar77,0);
  auVar79 = (undefined1  [16])0x0;
  for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
    if ((auVar31 & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
      auVar79 = auVar79 ^ ZEXT816(0xc200000000000000) << uVar2;
    }
  }
  auVar3 = vpshufd_avx(auVar3 ^ auVar77,0x4e);
  _ok((uint)((auVar79 ^ auVar78 ^ auVar3 ^ auVar80 ^ auVar76) == _DAT_0012b780),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/fusion.c",0x93);
  if ((ctx->ecb).aesni256 != '\0') {
    halt_baddata();
  }
  auVar6._8_8_ = 0;
  auVar6._0_8_ = ctx[1].ecb.keys.m128[4][0];
  auVar3 = (undefined1  [16])0x0;
  for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
    if ((auVar6 & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
      auVar3 = auVar3 ^ ZEXT816(0x6b2062726f776e20) << uVar2;
    }
  }
  auVar44._8_8_ = 0;
  auVar44._0_8_ = ctx[1].ecb.keys.m128[4][1];
  auVar76 = (undefined1  [16])0x0;
  for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
    if ((auVar44 & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
      auVar76 = auVar76 ^ ZEXT816(0x5468652071756963) << uVar2;
    }
  }
  auVar62._8_8_ = 0;
  auVar62._0_8_ = ctx[1].ecb.keys.m128[5][0];
  auVar78 = (undefined1  [16])0x0;
  for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
    if ((ZEXT816(0x3f4807521e020743) & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
      auVar78 = auVar78 ^ auVar62 << uVar2;
    }
  }
  auVar7._8_8_ = 0;
  auVar7._0_8_ = ctx[1].ecb.keys.m128[2][0];
  auVar77 = (undefined1  [16])0x0;
  for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
    if ((auVar7 & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
      auVar77 = auVar77 ^ ZEXT816(0x73206f7665722074) << uVar2;
    }
  }
  auVar45._8_8_ = 0;
  auVar45._0_8_ = ctx[1].ecb.keys.m128[2][1];
  auVar80 = (undefined1  [16])0x0;
  for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
    if ((auVar45 & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
      auVar80 = auVar80 ^ ZEXT816(0x666f78206a756d70) << uVar2;
    }
  }
  auVar63._8_8_ = 0;
  auVar63._0_8_ = ctx[1].ecb.keys.m128[3][0];
  auVar79 = (undefined1  [16])0x0;
  for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
    if ((ZEXT816(0x154f17560f074d04) & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
      auVar79 = auVar79 ^ auVar63 << uVar2;
    }
  }
  auVar8._8_8_ = 0;
  auVar8._0_8_ = ctx[1].ecb.keys.m128[0][0];
  auVar4 = (undefined1  [16])0x0;
  for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
    if ((auVar8 & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
      auVar4 = auVar4 ^ ZEXT816(0x646f672e00000000) << uVar2;
    }
  }
  auVar4 = auVar77 ^ auVar3 ^ auVar4;
  auVar46._8_8_ = 0;
  auVar46._0_8_ = ctx[1].ecb.keys.m128[0][1];
  auVar3 = (undefined1  [16])0x0;
  for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
    if ((auVar46 & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
      auVar3 = auVar3 ^ ZEXT816(0x6865206c617a7920) << uVar2;
    }
  }
  auVar3 = auVar80 ^ auVar76 ^ auVar3;
  auVar64._8_8_ = 0;
  auVar64._0_8_ = ctx[1].ecb.keys.m128[1][0];
  auVar76 = (undefined1  [16])0x0;
  for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
    if ((ZEXT816(0xc0a4742617a7920) & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
      auVar76 = auVar76 ^ auVar64 << uVar2;
    }
  }
  auVar76 = auVar79 ^ auVar78 ^ auVar76 ^ auVar4 ^ auVar3;
  auVar78 = vpslldq_avx(auVar76,8);
  auVar4 = auVar4 ^ auVar78;
  auVar78 = vpsrldq_avx(auVar76,8);
  auVar32._8_8_ = 0;
  auVar32._0_8_ = auVar4._0_8_;
  auVar76 = (undefined1  [16])0x0;
  for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
    if ((auVar32 & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
      auVar76 = auVar76 ^ ZEXT816(0xc200000000000000) << uVar2;
    }
  }
  auVar77 = vpshufd_avx(auVar4,0x4e);
  auVar33._8_8_ = 0;
  auVar33._0_8_ = SUB168(auVar76 ^ auVar77,0);
  auVar80 = (undefined1  [16])0x0;
  for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
    if ((auVar33 & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
      auVar80 = auVar80 ^ ZEXT816(0xc200000000000000) << uVar2;
    }
  }
  auVar76 = vpshufd_avx(auVar76 ^ auVar77,0x4e);
  _ok((uint)((auVar80 ^ auVar78 ^ auVar76 ^ auVar3) == _DAT_0012b790),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/fusion.c",0xa9);
  if ((ctx->ecb).aesni256 != '\0') {
    halt_baddata();
  }
  auVar9._8_8_ = 0;
  auVar9._0_8_ = ctx[1].ecb.keys.m128[6][0];
  auVar3 = (undefined1  [16])0x0;
  for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
    if ((auVar9 & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
      auVar3 = auVar3 ^ ZEXT816(0x73756d20646f6c6f) << uVar2;
    }
  }
  auVar47._8_8_ = 0;
  auVar47._0_8_ = ctx[1].ecb.keys.m128[6][1];
  auVar76 = (undefined1  [16])0x0;
  for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
    if ((auVar47 & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
      auVar76 = auVar76 ^ ZEXT816(0x4c6f72656d206970) << uVar2;
    }
  }
  auVar65._8_8_ = 0;
  auVar65._0_8_ = ctx[1].ecb.keys.m128[7][0];
  auVar78 = (undefined1  [16])0x0;
  for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
    if ((ZEXT816(0x3f1a1f45094f051f) & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
      auVar78 = auVar78 ^ auVar65 << uVar2;
    }
  }
  uVar1 = ctx[1].ecb.keys.m128[0][0];
  uVar70 = ctx[1].ecb.keys.m128[0][1];
  uVar71 = ctx[1].ecb.keys.m128[1][0];
  auVar10._8_8_ = 0;
  auVar10._0_8_ = ctx[1].ecb.keys.m128[4][0];
  auVar77 = (undefined1  [16])0x0;
  for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
    if ((auVar10 & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
      auVar77 = auVar77 ^ ZEXT816(0x65742c20636f6e73) << uVar2;
    }
  }
  auVar48._8_8_ = 0;
  auVar48._0_8_ = ctx[1].ecb.keys.m128[4][1];
  auVar80 = (undefined1  [16])0x0;
  for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
    if ((auVar48 & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
      auVar80 = auVar80 ^ ZEXT816(0x722073697420616d) << uVar2;
    }
  }
  auVar66._8_8_ = 0;
  auVar66._0_8_ = ctx[1].ecb.keys.m128[5][0];
  auVar79 = (undefined1  [16])0x0;
  for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
    if ((ZEXT816(0x17545f49174f0f1e) & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
      auVar79 = auVar79 ^ auVar66 << uVar2;
    }
  }
  auVar11._8_8_ = 0;
  auVar11._0_8_ = ctx[1].ecb.keys.m128[2][0];
  auVar4 = (undefined1  [16])0x0;
  for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
    if ((auVar11 & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
      auVar4 = auVar4 ^ ZEXT816(0x6164697069736369) << uVar2;
    }
  }
  auVar49._8_8_ = 0;
  auVar49._0_8_ = ctx[1].ecb.keys.m128[2][1];
  auVar42 = (undefined1  [16])0x0;
  for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
    if ((auVar49 & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
      auVar42 = auVar42 ^ ZEXT816(0x6563746574757220) << uVar2;
    }
  }
  auVar67._8_8_ = 0;
  auVar67._0_8_ = ctx[1].ecb.keys.m128[3][0];
  auVar60 = (undefined1  [16])0x0;
  for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
    if ((ZEXT816(0x4071d151d061149) & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
      auVar60 = auVar60 ^ auVar67 << uVar2;
    }
  }
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar1;
  auVar5 = (undefined1  [16])0x0;
  for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
    if ((auVar12 & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
      auVar5 = auVar5 ^ ZEXT816(0x2073656420646f20) << uVar2;
    }
  }
  auVar3 = auVar77 ^ auVar3 ^ auVar5 ^ auVar4;
  auVar50._8_8_ = 0;
  auVar50._0_8_ = uVar70;
  auVar77 = (undefined1  [16])0x0;
  for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
    if ((auVar50 & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
      auVar77 = auVar77 ^ ZEXT816(0x6e6720656c69742c) << uVar2;
    }
  }
  auVar76 = auVar80 ^ auVar76 ^ auVar42 ^ auVar77;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = uVar71;
  auVar77 = (undefined1  [16])0x0;
  for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
    if ((auVar13 & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
      auVar77 = auVar77 ^ ZEXT816(0x4e1445014c0d1b0c) << uVar2;
    }
  }
  auVar78 = auVar79 ^ auVar78 ^ auVar60 ^ auVar77 ^ auVar3 ^ auVar76;
  auVar77 = vpslldq_avx(auVar78,8);
  auVar3 = auVar3 ^ auVar77;
  auVar77 = vpsrldq_avx(auVar78,8);
  auVar34._8_8_ = 0;
  auVar34._0_8_ = auVar3._0_8_;
  auVar78 = (undefined1  [16])0x0;
  for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
    if ((auVar34 & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
      auVar78 = auVar78 ^ ZEXT816(0xc200000000000000) << uVar2;
    }
  }
  auVar3 = vpshufd_avx(auVar3,0x4e);
  auVar35._8_8_ = 0;
  auVar35._0_8_ = SUB168(auVar78 ^ auVar3,0);
  auVar80 = (undefined1  [16])0x0;
  for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
    if ((auVar35 & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
      auVar80 = auVar80 ^ ZEXT816(0xc200000000000000) << uVar2;
    }
  }
  auVar3 = vpshufd_avx(auVar78 ^ auVar3,0x4e);
  auVar3 = auVar80 ^ auVar77 ^ auVar3 ^ auVar76 ^ _DAT_0012b7a0;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = uVar1;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = auVar3._0_8_;
  auVar76 = (undefined1  [16])0x0;
  for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
    if ((auVar14 & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
      auVar76 = auVar76 ^ auVar26 << uVar2;
    }
  }
  auVar51._8_8_ = 0;
  auVar51._0_8_ = uVar70;
  auVar58._8_8_ = 0;
  auVar58._0_8_ = auVar3._8_8_;
  auVar78 = (undefined1  [16])0x0;
  for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
    if ((auVar51 & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
      auVar78 = auVar78 ^ auVar58 << uVar2;
    }
  }
  auVar77 = vpshufd_avx(auVar3,0xee);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = uVar71;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = SUB168(auVar3 ^ auVar77,0);
  auVar3 = (undefined1  [16])0x0;
  for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
    if ((auVar15 & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
      auVar3 = auVar3 ^ auVar27 << uVar2;
    }
  }
  auVar3 = auVar76 ^ auVar78 ^ auVar3;
  auVar80 = vpslldq_avx(auVar3,8);
  auVar77 = vpsrldq_avx(auVar3,8);
  auVar36._8_8_ = 0;
  auVar36._0_8_ = SUB168(auVar76 ^ auVar80,0);
  auVar3 = (undefined1  [16])0x0;
  for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
    if ((auVar36 & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
      auVar3 = auVar3 ^ ZEXT816(0xc200000000000000) << uVar2;
    }
  }
  auVar76 = vpshufd_avx(auVar76 ^ auVar80,0x4e);
  auVar37._8_8_ = 0;
  auVar37._0_8_ = SUB168(auVar3 ^ auVar76,0);
  auVar80 = (undefined1  [16])0x0;
  for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
    if ((auVar37 & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
      auVar80 = auVar80 ^ ZEXT816(0xc200000000000000) << uVar2;
    }
  }
  auVar3 = vpshufd_avx(auVar3 ^ auVar76,0x4e);
  _ok((uint)((auVar80 ^ auVar77 ^ auVar3 ^ auVar78) == _DAT_0012b7b0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/fusion.c",0xc5);
  if ((ctx->ecb).aesni256 != '\0') {
    halt_baddata();
  }
  auVar16._8_8_ = 0;
  auVar16._0_8_ = ctx[1].ecb.keys.m128[6][0];
  auVar3 = (undefined1  [16])0x0;
  for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
    if ((auVar16 & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
      auVar3 = auVar3 ^ ZEXT816(0x73756d20646f6c6f) << uVar2;
    }
  }
  auVar52._8_8_ = 0;
  auVar52._0_8_ = ctx[1].ecb.keys.m128[6][1];
  auVar76 = (undefined1  [16])0x0;
  for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
    if ((auVar52 & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
      auVar76 = auVar76 ^ ZEXT816(0x4c6f72656d206970) << uVar2;
    }
  }
  auVar68._8_8_ = 0;
  auVar68._0_8_ = ctx[1].ecb.keys.m128[7][0];
  auVar78 = (undefined1  [16])0x0;
  for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
    if ((ZEXT816(0x3f1a1f45094f051f) & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
      auVar78 = auVar78 ^ auVar68 << uVar2;
    }
  }
  auVar17._8_8_ = 0;
  auVar17._0_8_ = ctx[1].ecb.keys.m128[4][0];
  auVar77 = (undefined1  [16])0x0;
  for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
    if ((auVar17 & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
      auVar77 = auVar77 ^ ZEXT816(0x65742c20636f6e73) << uVar2;
    }
  }
  auVar53._8_8_ = 0;
  auVar53._0_8_ = ctx[1].ecb.keys.m128[4][1];
  auVar80 = (undefined1  [16])0x0;
  for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
    if ((auVar53 & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
      auVar80 = auVar80 ^ ZEXT816(0x722073697420616d) << uVar2;
    }
  }
  auVar69._8_8_ = 0;
  auVar69._0_8_ = ctx[1].ecb.keys.m128[5][0];
  auVar79 = (undefined1  [16])0x0;
  for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
    if ((ZEXT816(0x17545f49174f0f1e) & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
      auVar79 = auVar79 ^ auVar69 << uVar2;
    }
  }
  uVar1 = ctx[1].ecb.keys.m128[0][0];
  uVar70 = ctx[1].ecb.keys.m128[0][1];
  uVar71 = ctx[1].ecb.keys.m128[1][0];
  uVar72 = ctx[1].ecb.keys.m128[2][0];
  uVar73 = ctx[1].ecb.keys.m128[2][1];
  uVar74 = ctx[1].ecb.keys.m128[3][0];
  auVar18._8_8_ = 0;
  auVar18._0_8_ = uVar72;
  auVar4 = (undefined1  [16])0x0;
  for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
    if ((auVar18 & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
      auVar4 = auVar4 ^ ZEXT816(0x6164697069736369) << uVar2;
    }
  }
  auVar54._8_8_ = 0;
  auVar54._0_8_ = uVar73;
  auVar42 = (undefined1  [16])0x0;
  for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
    if ((auVar54 & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
      auVar42 = auVar42 ^ ZEXT816(0x6563746574757220) << uVar2;
    }
  }
  auVar19._8_8_ = 0;
  auVar19._0_8_ = uVar74;
  auVar60 = (undefined1  [16])0x0;
  for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
    if ((auVar19 & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
      auVar60 = auVar60 ^ ZEXT816(0x4071d151d061149) << uVar2;
    }
  }
  auVar20._8_8_ = 0;
  auVar20._0_8_ = uVar1;
  auVar5 = (undefined1  [16])0x0;
  for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
    if ((auVar20 & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
      auVar5 = auVar5 ^ ZEXT816(0x2073656420646f20) << uVar2;
    }
  }
  auVar3 = auVar77 ^ auVar3 ^ auVar5 ^ auVar4;
  auVar55._8_8_ = 0;
  auVar55._0_8_ = uVar70;
  auVar77 = (undefined1  [16])0x0;
  for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
    if ((auVar55 & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
      auVar77 = auVar77 ^ ZEXT816(0x6e6720656c69742c) << uVar2;
    }
  }
  auVar76 = auVar80 ^ auVar76 ^ auVar42 ^ auVar77;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = uVar71;
  auVar77 = (undefined1  [16])0x0;
  for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
    if ((auVar21 & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
      auVar77 = auVar77 ^ ZEXT816(0x4e1445014c0d1b0c) << uVar2;
    }
  }
  auVar78 = auVar79 ^ auVar78 ^ auVar60 ^ auVar77 ^ auVar3 ^ auVar76;
  auVar77 = vpslldq_avx(auVar78,8);
  auVar3 = auVar3 ^ auVar77;
  auVar77 = vpsrldq_avx(auVar78,8);
  auVar38._8_8_ = 0;
  auVar38._0_8_ = auVar3._0_8_;
  auVar78 = (undefined1  [16])0x0;
  for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
    if ((auVar38 & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
      auVar78 = auVar78 ^ ZEXT816(0xc200000000000000) << uVar2;
    }
  }
  auVar3 = vpshufd_avx(auVar3,0x4e);
  auVar39._8_8_ = 0;
  auVar39._0_8_ = SUB168(auVar78 ^ auVar3,0);
  auVar80 = (undefined1  [16])0x0;
  for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
    if ((auVar39 & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
      auVar80 = auVar80 ^ ZEXT816(0xc200000000000000) << uVar2;
    }
  }
  auVar3 = vpshufd_avx(auVar78 ^ auVar3,0x4e);
  auVar3 = auVar80 ^ auVar77 ^ auVar3 ^ auVar76 ^ _DAT_0012b7c0;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = uVar72;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = auVar3._0_8_;
  auVar76 = (undefined1  [16])0x0;
  for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
    if ((auVar22 & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
      auVar76 = auVar76 ^ auVar28 << uVar2;
    }
  }
  auVar56._8_8_ = 0;
  auVar56._0_8_ = uVar73;
  auVar59._8_8_ = 0;
  auVar59._0_8_ = auVar3._8_8_;
  auVar78 = (undefined1  [16])0x0;
  for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
    if ((auVar56 & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
      auVar78 = auVar78 ^ auVar59 << uVar2;
    }
  }
  auVar77 = vpshufd_avx(auVar3,0xee);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = uVar74;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = SUB168(auVar3 ^ auVar77,0);
  auVar3 = (undefined1  [16])0x0;
  for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
    if ((auVar23 & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
      auVar3 = auVar3 ^ auVar29 << uVar2;
    }
  }
  auVar24._8_8_ = 0;
  auVar24._0_8_ = uVar1;
  auVar77 = (undefined1  [16])0x0;
  for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
    if ((auVar24 & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
      auVar77 = auVar77 ^ ZEXT816(0x74207574206c6100) << uVar2;
    }
  }
  auVar57._8_8_ = 0;
  auVar57._0_8_ = uVar70;
  auVar80 = (undefined1  [16])0x0;
  for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
    if ((auVar57 & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
      auVar80 = auVar80 ^ ZEXT816(0x6e6369646964756e) << uVar2;
    }
  }
  auVar25._8_8_ = 0;
  auVar25._0_8_ = uVar71;
  auVar79 = (undefined1  [16])0x0;
  for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
    if ((auVar25 & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
      auVar79 = auVar79 ^ ZEXT816(0x1a431c104908146e) << uVar2;
    }
  }
  auVar3 = auVar3 ^ auVar79 ^ auVar77 ^ auVar76 ^ auVar80 ^ auVar78;
  auVar79 = vpslldq_avx(auVar3,8);
  auVar79 = auVar77 ^ auVar76 ^ auVar79;
  auVar76 = vpsrldq_avx(auVar3,8);
  auVar40._8_8_ = 0;
  auVar40._0_8_ = auVar79._0_8_;
  auVar3 = (undefined1  [16])0x0;
  for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
    if ((auVar40 & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
      auVar3 = auVar3 ^ ZEXT816(0xc200000000000000) << uVar2;
    }
  }
  auVar77 = vpshufd_avx(auVar79,0x4e);
  auVar41._8_8_ = 0;
  auVar41._0_8_ = SUB168(auVar3 ^ auVar77,0);
  auVar79 = (undefined1  [16])0x0;
  for (uVar2 = 0; uVar2 < 0x40; uVar2 = uVar2 + 1) {
    if ((auVar41 & (undefined1  [16])0x1 << uVar2) != (undefined1  [16])0x0) {
      auVar79 = auVar79 ^ ZEXT816(0xc200000000000000) << uVar2;
    }
  }
  auVar3 = vpshufd_avx(auVar3 ^ auVar77,0x4e);
  _ok((uint)((auVar79 ^ auVar76 ^ auVar3 ^ auVar80 ^ auVar78) == _DAT_0012b7d0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/fusion.c",0xe2);
  free(ctx);
  return;
}

Assistant:

static void test_gfmul(void)
{
    ptls_fusion_aesgcm_context_t *ctx;
    size_t ghash_cnt = 4;

    ctx = malloc(calc_aesgcm_context_size(&ghash_cnt, ptls_fusion_can_aesni256));
    *ctx = (ptls_fusion_aesgcm_context_t){
        .ecb = {.aesni256 = ptls_fusion_can_aesni256},
        .capacity = ghash_cnt * 16,
    };

    __m128i H0 = _mm_loadu_si128((void *)"hello world bye");
    if (ctx->ecb.aesni256) {
        ((struct ptls_fusion_aesgcm_context256 *)ctx)->ghash[0].H[1] = H0;
    } else {
        ((struct ptls_fusion_aesgcm_context128 *)ctx)->ghash[0].H = H0;
    }

    while (ctx->ghash_cnt < ghash_cnt)
        setup_one_ghash_entry(ctx);

#define GHASH128 (((struct ptls_fusion_aesgcm_context128 *)ctx)->ghash)
#define GHASH256 (((struct ptls_fusion_aesgcm_context256 *)ctx)->ghash)

    {                                                     /* one block */
        static const char input[32] = "deaddeadbeefbeef"; /* latter 16-bytes are NUL */
        __m128i hash;
        if (ctx->ecb.aesni256) {
            struct ptls_fusion_gfmul_state256 state;
            state.lo = _mm256_setzero_si256();
            gfmul_firststep256(&state, _mm256_loadu_si256((void *)input), 1, GHASH256);
            gfmul_reduce256(&state);
            hash = _mm256_castsi256_si128(state.lo);
        } else {
            struct ptls_fusion_gfmul_state128 state;
            state.lo = _mm_setzero_si128();
            gfmul_firststep128(&state, _mm_loadu_si128((void *)input), GHASH128);
            gfmul_reduce128(&state);
            hash = state.lo;
        }
        ok(memcmp(&hash, "\x12\xd9\xd9\x14\x8b\x3f\x20\xbd\x20\x2a\xa5\x9e\x17\xa8\xb0\x7b", 16) == 0);
    }

    { /* two blocks */
        static const char input[32] = "Lorem ipsum dolor sit amet, con";
        __m128i hash;
        if (ctx->ecb.aesni256) {
            struct ptls_fusion_gfmul_state256 state;
            state.lo = _mm256_setzero_si256();
            gfmul_firststep256(&state, _mm256_loadu_si256((void *)input), 0, GHASH256);
            gfmul_reduce256(&state);
            hash = _mm256_castsi256_si128(state.lo);
        } else {
            struct ptls_fusion_gfmul_state128 state;
            state.lo = _mm_setzero_si128();
            gfmul_firststep128(&state, _mm_loadu_si128((void *)input), GHASH128 + 1);
            gfmul_nextstep128(&state, _mm_loadu_si128((void *)(input + 16)), GHASH128);
            gfmul_reduce128(&state);
            hash = state.lo;
        }
        ok(memcmp(&hash, "\xda\xdf\xe8\x9b\xc7\x8c\xbd\x5c\xa7\xc1\x83\x9a\xa2\x9f\x80\x55", 16) == 0);
    }

    { /* three blocks */
        static const char input[64] = "The quick brown fox jumps over the lazy dog.";
        __m128i hash;
        if (ctx->ecb.aesni256) {
            struct ptls_fusion_gfmul_state256 state;
            state.lo = _mm256_setzero_si256();
            gfmul_firststep256(&state, _mm256_loadu_si256((void *)input), 1, GHASH256 + 1);
            gfmul_nextstep256(&state, _mm256_loadu_si256((void *)(input + 16)), GHASH256);
            gfmul_reduce256(&state);
            hash = _mm256_castsi256_si128(state.lo);
        } else {
            struct ptls_fusion_gfmul_state128 state;
            state.lo = _mm_setzero_si128();
            gfmul_firststep128(&state, _mm_loadu_si128((void *)input), GHASH128 + 2);
            gfmul_nextstep128(&state, _mm_loadu_si128((void *)(input + 16)), GHASH128 + 1);
            gfmul_nextstep128(&state, _mm_loadu_si128((void *)(input + 32)), GHASH128);
            gfmul_reduce128(&state);
            hash = state.lo;
        }
        ok(memcmp(&hash, "\xad\xdf\x91\x52\x38\x40\xf7\xc3\x85\xaf\x41\xb1\x7d\xed\x4b\x56", 16) == 0);
    }

    { /* five blocks */
        static const char input[96] =
            "Lorem ipsum dolor sit amet, consectetur adipiscing elit, sed do eiusmod tempor "; /* last 16 bytes are NUL */
        __m128i hash;
        if (ctx->ecb.aesni256) {
            struct ptls_fusion_gfmul_state256 state;
            state.lo = _mm256_setzero_si256();
            gfmul_firststep256(&state, _mm256_loadu_si256((void *)input), 0, GHASH256 + 1);
            gfmul_nextstep256(&state, _mm256_loadu_si256((void *)(input + 32)), GHASH256);
            gfmul_reduce256(&state);
            gfmul_firststep256(&state, _mm256_loadu_si256((void *)(input + 64)), 1, GHASH256);
            gfmul_reduce256(&state);
            hash = _mm256_castsi256_si128(state.lo);
        } else {
            struct ptls_fusion_gfmul_state128 state;
            state.lo = _mm_setzero_si128();
            gfmul_firststep128(&state, _mm_loadu_si128((void *)input), GHASH128 + 3);
            gfmul_nextstep128(&state, _mm_loadu_si128((void *)(input + 16)), GHASH128 + 2);
            gfmul_nextstep128(&state, _mm_loadu_si128((void *)(input + 32)), GHASH128 + 1);
            gfmul_nextstep128(&state, _mm_loadu_si128((void *)(input + 48)), GHASH128);
            gfmul_reduce128(&state);
            gfmul_firststep128(&state, _mm_loadu_si128((void *)(input + 64)), GHASH128);
            gfmul_reduce128(&state);
            hash = state.lo;
        }
        ok(memcmp(&hash, "\xb8\xab\x1b\xa8\xf2\x92\xf3\x89\x44\x9d\x39\xf6\xb6\x37\xca\x5d", 16) == 0);
    }

    { /* six blocks */
        static const char input[96] =
            "Lorem ipsum dolor sit amet, consectetur adipiscing elit, sed do eiusmod tempor incididunt ut la";
        __m128i hash;
        if (ctx->ecb.aesni256) {
            struct ptls_fusion_gfmul_state256 state;
            state.lo = _mm256_setzero_si256();
            gfmul_firststep256(&state, _mm256_loadu_si256((void *)input), 0, GHASH256 + 1);
            gfmul_nextstep256(&state, _mm256_loadu_si256((void *)(input + 32)), GHASH256);
            gfmul_reduce256(&state);
            gfmul_firststep256(&state, _mm256_loadu_si256((void *)(input + 64)), 0, GHASH256);
            gfmul_reduce256(&state);
            hash = _mm256_castsi256_si128(state.lo);
        } else {
            struct ptls_fusion_gfmul_state128 state;
            state.lo = _mm_setzero_si128();
            gfmul_firststep128(&state, _mm_loadu_si128((void *)input), GHASH128 + 3);
            gfmul_nextstep128(&state, _mm_loadu_si128((void *)(input + 16)), GHASH128 + 2);
            gfmul_nextstep128(&state, _mm_loadu_si128((void *)(input + 32)), GHASH128 + 1);
            gfmul_nextstep128(&state, _mm_loadu_si128((void *)(input + 48)), GHASH128);
            gfmul_reduce128(&state);
            gfmul_firststep128(&state, _mm_loadu_si128((void *)(input + 64)), GHASH128 + 1);
            gfmul_nextstep128(&state, _mm_loadu_si128((void *)(input + 80)), GHASH128);
            gfmul_reduce128(&state);
            hash = state.lo;
        }
        ok(memcmp(&hash, "\x52\xce\x25\x22\x86\x2c\x91\xa4\xe7\x4e\xf9\x9a\x32\x77\xbd\x3e", 16) == 0);
    }

    free(ctx);

#undef GHASH128
#undef GHASH256
}